

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test28(char *infile,char *password,char *outfile,char *xarg)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int local_64;
  int local_60;
  int local_5c;
  qpdf_oh item3;
  qpdf_oh item2;
  qpdf_oh item;
  int i;
  qpdf_oh cloned_mediabox;
  qpdf_oh wrapped_mediabox;
  qpdf_oh mediabox;
  qpdf_oh page1;
  qpdf_oh kids;
  qpdf_oh pages;
  qpdf_oh root;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  qpdf_read(qpdf,infile,password);
  uVar1 = qpdf_get_root(qpdf);
  uVar1 = qpdf_oh_get_key(qpdf,uVar1,"/Pages");
  uVar1 = qpdf_oh_get_key(qpdf,uVar1,"/Kids");
  uVar1 = qpdf_oh_get_array_item(qpdf,uVar1,0);
  iVar2 = qpdf_oh_get_key(qpdf,uVar1,"/MediaBox");
  iVar3 = qpdf_oh_wrap_in_array(qpdf,iVar2);
  iVar4 = qpdf_oh_new_object(qpdf,iVar2);
  if (iVar3 == iVar2) {
    __assert_fail("wrapped_mediabox != mediabox",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x368,"void test28(const char *, const char *, const char *, const char *)");
  }
  if (iVar4 == iVar2) {
    __assert_fail("cloned_mediabox != mediabox",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x369,"void test28(const char *, const char *, const char *, const char *)");
  }
  iVar5 = qpdf_oh_get_array_n_items(qpdf,iVar3);
  if (iVar5 != 4) {
    __assert_fail("qpdf_oh_get_array_n_items(qpdf, wrapped_mediabox) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                  0x36a,"void test28(const char *, const char *, const char *, const char *)");
  }
  item2 = 0;
  while( true ) {
    if (3 < (int)item2) {
      return;
    }
    uVar1 = qpdf_oh_get_array_item(qpdf,iVar2,item2);
    uVar6 = qpdf_oh_get_array_item(qpdf,iVar3,item2);
    uVar7 = qpdf_oh_get_array_item(qpdf,iVar4,item2);
    iVar5 = qpdf_oh_get_int_value_as_int(qpdf,uVar1);
    if (item2 == 0) {
      local_5c = 0;
    }
    else {
      if (item2 == 1) {
        local_60 = 0;
      }
      else {
        if (item2 == 2) {
          local_64 = 0x264;
        }
        else {
          local_64 = -1;
          if (item2 == 3) {
            local_64 = 0x318;
          }
        }
        local_60 = local_64;
      }
      local_5c = local_60;
    }
    if (iVar5 != local_5c) {
      __assert_fail("qpdf_oh_get_int_value_as_int(qpdf, item) == (i == 0 ? 0 : i == 1 ? 0 : i == 2 ? 612 : i == 3 ? 792 : -1)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x375,"void test28(const char *, const char *, const char *, const char *)");
    }
    iVar5 = qpdf_oh_get_int_value_as_int(qpdf,uVar1);
    iVar8 = qpdf_oh_get_int_value_as_int(qpdf,uVar6);
    if (iVar5 != iVar8) {
      __assert_fail("qpdf_oh_get_int_value_as_int(qpdf, item) == qpdf_oh_get_int_value_as_int(qpdf, item2)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x377,"void test28(const char *, const char *, const char *, const char *)");
    }
    iVar5 = qpdf_oh_get_int_value_as_int(qpdf,uVar1);
    iVar8 = qpdf_oh_get_int_value_as_int(qpdf,uVar7);
    if (iVar5 != iVar8) break;
    qpdf_oh_release(qpdf,uVar1);
    item2 = item2 + 1;
  }
  __assert_fail("qpdf_oh_get_int_value_as_int(qpdf, item) == qpdf_oh_get_int_value_as_int(qpdf, item3)"
                ,"/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/qpdf-ctest.c",
                0x379,"void test28(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test28(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* This test case is designed for minimal.pdf. */

    /* Look at the media box. The media box is in array. Trivially
     * wrap it and also clone it and make sure we get different
     * handles with the same contents.
     */
    qpdf_read(qpdf, infile, password);
    qpdf_oh root = qpdf_get_root(qpdf);
    qpdf_oh pages = qpdf_oh_get_key(qpdf, root, "/Pages");
    qpdf_oh kids = qpdf_oh_get_key(qpdf, pages, "/Kids");
    qpdf_oh page1 = qpdf_oh_get_array_item(qpdf, kids, 0);
    qpdf_oh mediabox = qpdf_oh_get_key(qpdf, page1, "/MediaBox");
    qpdf_oh wrapped_mediabox = qpdf_oh_wrap_in_array(qpdf, mediabox);
    qpdf_oh cloned_mediabox = qpdf_oh_new_object(qpdf, mediabox);
    assert(wrapped_mediabox != mediabox);
    assert(cloned_mediabox != mediabox);
    assert(qpdf_oh_get_array_n_items(qpdf, wrapped_mediabox) == 4);
    for (int i = 0; i < 4; ++i) {
        qpdf_oh item = qpdf_oh_get_array_item(qpdf, mediabox, i);
        qpdf_oh item2 = qpdf_oh_get_array_item(qpdf, wrapped_mediabox, i);
        qpdf_oh item3 = qpdf_oh_get_array_item(qpdf, cloned_mediabox, i);
        assert(
            qpdf_oh_get_int_value_as_int(qpdf, item) ==
            (i == 0       ? 0
                 : i == 1 ? 0
                 : i == 2 ? 612
                 : i == 3 ? 792
                          : -1));
        assert(
            qpdf_oh_get_int_value_as_int(qpdf, item) == qpdf_oh_get_int_value_as_int(qpdf, item2));
        assert(
            qpdf_oh_get_int_value_as_int(qpdf, item) == qpdf_oh_get_int_value_as_int(qpdf, item3));
        qpdf_oh_release(qpdf, item);
    }
}